

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptor::InternalTypeOnceInit(FieldDescriptor *this)

{
  int iVar1;
  FileDescriptor *pFVar2;
  string *psVar3;
  LogMessage *this_00;
  EnumValueDescriptor *pEVar4;
  FieldDescriptor *in_RDI;
  Symbol SVar5;
  Symbol result_1;
  size_type last_dot;
  string name;
  Symbol result;
  LogMessage *in_stack_fffffffffffffe78;
  LogMessage *other;
  LogMessage *in_stack_fffffffffffffe80;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffffe88;
  LogLevel_conflict level;
  undefined4 in_stack_fffffffffffffe90;
  Type in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffee7;
  string *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  long local_90;
  string local_88 [32];
  Type local_68;
  anon_union_8_8_13f84498_for_Symbol_2 local_60;
  byte local_41;
  
  pFVar2 = file(in_RDI);
  local_41 = 0;
  if (((byte)pFVar2[0x41] & 1) != 1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88._4_4_,(char *)in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    local_41 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  if ((local_41 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4c6eca);
  }
  if (*(long *)(in_RDI + 0x80) != 0) {
    pFVar2 = file(in_RDI);
    FileDescriptor::pool(pFVar2);
    SVar5 = DescriptorPool::CrossLinkOnDemandHelper
                      ((DescriptorPool *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (bool)in_stack_fffffffffffffee7);
    local_60 = SVar5.field_1;
    local_68 = SVar5.type;
    if (local_68 == MESSAGE) {
      *(undefined4 *)(in_RDI + 0x38) = 0xb;
      *(anon_union_8_8_13f84498_for_Symbol_2 *)(in_RDI + 0x68) = local_60;
    }
    else if (local_68 == ENUM) {
      *(undefined4 *)(in_RDI + 0x38) = 0xe;
      *(anon_union_8_8_13f84498_for_Symbol_2 *)(in_RDI + 0x70) = local_60;
    }
  }
  if ((*(long *)(in_RDI + 0x70) != 0) && (*(long *)(in_RDI + 0x90) == 0)) {
    if (*(long *)(in_RDI + 0x88) != 0) {
      psVar3 = EnumDescriptor::full_name_abi_cxx11_(*(EnumDescriptor **)(in_RDI + 0x70));
      std::__cxx11::string::string(local_88,(string *)psVar3);
      local_90 = std::__cxx11::string::find_last_of((char)local_88,0x2e);
      if (local_90 == -1) {
        std::__cxx11::string::operator=(local_88,*(string **)(in_RDI + 0x88));
      }
      else {
        std::__cxx11::string::substr((ulong)local_f0,(ulong)local_88);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe88.descriptor,(char *)in_stack_fffffffffffffe80);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe88.descriptor,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe80);
        std::__cxx11::string::operator=(local_88,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_f0);
      }
      pFVar2 = file(in_RDI);
      FileDescriptor::pool(pFVar2);
      SVar5 = DescriptorPool::CrossLinkOnDemandHelper
                        ((DescriptorPool *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (bool)in_stack_fffffffffffffee7);
      in_stack_fffffffffffffe88 = SVar5.field_1;
      in_stack_fffffffffffffe94 = SVar5.type;
      if (in_stack_fffffffffffffe94 == ENUM_VALUE) {
        *(anon_union_8_8_13f84498_for_Symbol_2 *)(in_RDI + 0x90) = in_stack_fffffffffffffe88;
      }
      std::__cxx11::string::~string(local_88);
    }
    level = in_stack_fffffffffffffe88._4_4_;
    if (*(long *)(in_RDI + 0x90) == 0) {
      iVar1 = EnumDescriptor::value_count(*(EnumDescriptor **)(in_RDI + 0x70));
      if (iVar1 == 0) {
        other = (LogMessage *)&stack0xfffffffffffffec8;
        internal::LogMessage::LogMessage
                  ((LogMessage *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),level
                   ,(char *)in_stack_fffffffffffffe80,(int)((ulong)other >> 0x20));
        this_00 = internal::LogMessage::operator<<(in_stack_fffffffffffffe80,(char *)other);
        internal::LogFinisher::operator=((LogFinisher *)this_00,other);
        internal::LogMessage::~LogMessage((LogMessage *)0x4c7269);
      }
      pEVar4 = EnumDescriptor::value(*(EnumDescriptor **)(in_RDI + 0x70),0);
      *(EnumValueDescriptor **)(in_RDI + 0x90) = pEVar4;
    }
  }
  return;
}

Assistant:

void FieldDescriptor::InternalTypeOnceInit() const {
  GOOGLE_CHECK(file()->finished_building_ == true);
  if (type_name_) {
    Symbol result = file()->pool()->CrossLinkOnDemandHelper(
        *type_name_, type_ == FieldDescriptor::TYPE_ENUM);
    if (result.type == Symbol::MESSAGE) {
      type_ = FieldDescriptor::TYPE_MESSAGE;
      message_type_ = result.descriptor;
    } else if (result.type == Symbol::ENUM) {
      type_ = FieldDescriptor::TYPE_ENUM;
      enum_type_ = result.enum_descriptor;
    }
  }
  if (enum_type_ && !default_value_enum_) {
    if (default_value_enum_name_) {
      // Have to build the full name now instead of at CrossLink time,
      // because enum_type_ may not be known at the time.
      std::string name = enum_type_->full_name();
      // Enum values reside in the same scope as the enum type.
      std::string::size_type last_dot = name.find_last_of('.');
      if (last_dot != std::string::npos) {
        name = name.substr(0, last_dot) + "." + *default_value_enum_name_;
      } else {
        name = *default_value_enum_name_;
      }
      Symbol result = file()->pool()->CrossLinkOnDemandHelper(name, true);
      if (result.type == Symbol::ENUM_VALUE) {
        default_value_enum_ = result.enum_value_descriptor;
      }
    }
    if (!default_value_enum_) {
      // We use the first defined value as the default
      // if a default is not explicitly defined.
      GOOGLE_CHECK(enum_type_->value_count());
      default_value_enum_ = enum_type_->value(0);
    }
  }
}